

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O2

void run_CALL(WorkerP *w,Task *__dq_head)

{
  long lVar1;
  FILE *pFVar2;
  MTBDD MVar3;
  BDD BVar4;
  size_t sVar5;
  BDDVAR arg_3;
  BDDVAR arg_3_00;
  BDDVAR arg_3_01;
  BDDVAR arg_3_02;
  BDDVAR arg_3_03;
  BDDVAR arg_3_04;
  BDDVAR arg_3_05;
  BDDVAR arg_3_06;
  BDDVAR arg_3_07;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 uVar6;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  BDD BVar10;
  long lVar11;
  MTBDD *pMVar12;
  size_t k_2;
  ulong uVar13;
  MTBDD *pMVar14;
  size_t i_2;
  char *pcVar15;
  size_t k;
  ulong uVar16;
  double dVar17;
  double dVar18;
  size_t sStack_80;
  BDD local_78;
  ulong local_70;
  double local_68;
  MTBDD *local_60;
  MTBDD local_58;
  BDD vars;
  MTBDD *local_48;
  MTBDD local_40;
  BDD temp;
  BDD res;
  
  sStack_80 = 0x102476;
  local_68 = wctime();
  lVar1 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar12 = (MTBDD *)((long)&local_78 + lVar1);
  pMVar14 = pMVar12;
  for (uVar7 = 0; uVar7 < size * size; uVar7 = uVar7 + 1) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1024b3;
    MVar3 = mtbdd_ithvar((uint32_t)uVar7);
    *pMVar14 = MVar3;
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1024be;
    mtbdd_protect(pMVar14);
    pMVar14 = pMVar14 + 1;
  }
  temp = 0x8000000000000000;
  local_40 = 0x8000000000000000;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1024eb;
  mtbdd_protect(&temp);
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1024f3;
  mtbdd_protect(&local_40);
  local_58 = 0x8000000000000000;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1024ff;
  mtbdd_protect(&local_58);
  uVar6 = extraout_RDX;
  for (uVar7 = 0; MVar3 = local_58, pFVar2 = _stdout, uVar7 < size * size; uVar7 = uVar7 + 1) {
    BVar10 = pMVar12[uVar7];
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10251f;
    local_58 = sylvan_and_RUN(MVar3,BVar10,(BDDVAR)uVar6);
    uVar6 = extraout_RDX_00;
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102537;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102550;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",dVar17 - t_start);
  pFVar2 = _stdout;
  pcVar15 = "[% 8.2f] Encoding rows...\n";
  if (report_minor != 0) {
    pcVar15 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102571;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102586;
  fprintf(pFVar2,pcVar15,dVar17 - t_start);
  lVar11 = 0;
  uVar7 = 0;
  uVar6 = extraout_RDX_01;
  while( true ) {
    if (size <= uVar7) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1025b8;
      printf("%zu... ",uVar7);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1025c7;
      fflush(_stdout);
      uVar6 = extraout_RDX_02;
    }
    for (uVar8 = 0; uVar8 < size; uVar8 = uVar8 + 1) {
      BVar10 = 0x8000000000000000;
      local_40 = 0x8000000000000000;
      uVar9 = size;
      for (uVar16 = 0; uVar16 < uVar9; uVar16 = uVar16 + 1) {
        if (uVar8 != uVar16) {
          uVar9 = *(ulong *)((long)pMVar12 + uVar16 * 8 + uVar9 * lVar11);
          *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102611;
          BVar10 = sylvan_and_RUN(BVar10,uVar9 ^ 0x8000000000000000,(BDDVAR)uVar6);
          local_40 = BVar10;
          uVar9 = size;
          uVar6 = extraout_RDX_03;
        }
      }
      BVar4 = pMVar12[uVar9 * uVar7 + uVar8];
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102649;
      BVar4 = sylvan_and_RUN(BVar10 ^ 0x8000000000000000,BVar4,(BDDVAR)uVar6);
      BVar10 = temp;
      local_40 = BVar4 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10265c;
      temp = sylvan_and_RUN(BVar10,BVar4 ^ 0x8000000000000000,arg_3);
      uVar6 = extraout_RDX_04;
    }
    uVar7 = uVar7 + 1;
    lVar11 = lVar11 + 8;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 10;
    uVar6 = *(undefined8 *)((long)&sStack_80 + lVar1);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102681;
    putchar((int)uVar6);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102699;
    dVar17 = wctime();
    BVar10 = temp;
    MVar3 = local_58;
    local_48 = (MTBDD *)(dVar17 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1026b3;
    dVar17 = sylvan_satcount_RUN(BVar10,MVar3,arg_3_00);
    pMVar14 = local_48;
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1026cd;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar14,dVar17);
  }
  pFVar2 = _stdout;
  pcVar15 = "[% 8.2f] Encoding columns...\n";
  if (report_minor != 0) {
    pcVar15 = "[% 8.2f] Encoding columns... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1026f5;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10270a;
  fprintf(pFVar2,pcVar15,dVar17 - t_start);
  uVar7 = 0;
  uVar6 = extraout_RDX_05;
  while( true ) {
    if (size <= uVar7) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102739;
      printf("%zu... ",uVar7);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102748;
      fflush(_stdout);
      uVar6 = extraout_RDX_06;
    }
    for (uVar8 = 0; uVar8 < size; uVar8 = uVar8 + 1) {
      BVar10 = 0x8000000000000000;
      local_40 = 0x8000000000000000;
      uVar9 = size;
      for (uVar16 = 0; uVar16 < uVar9; uVar16 = uVar16 + 1) {
        if (uVar8 != uVar16) {
          uVar9 = pMVar12[uVar7 + uVar9 * uVar16];
          *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10279a;
          BVar10 = sylvan_and_RUN(BVar10,uVar9 ^ 0x8000000000000000,(BDDVAR)uVar6);
          local_40 = BVar10;
          uVar9 = size;
          uVar6 = extraout_RDX_07;
        }
      }
      BVar4 = pMVar12[uVar7 + uVar9 * uVar8];
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1027c7;
      BVar4 = sylvan_and_RUN(BVar10 ^ 0x8000000000000000,BVar4,(BDDVAR)uVar6);
      BVar10 = temp;
      local_40 = BVar4 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1027da;
      temp = sylvan_and_RUN(BVar10,BVar4 ^ 0x8000000000000000,arg_3_01);
      uVar6 = extraout_RDX_08;
    }
    uVar7 = uVar7 + 1;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 10;
    uVar6 = *(undefined8 *)((long)&sStack_80 + lVar1);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1027fb;
    putchar((int)uVar6);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102813;
    dVar17 = wctime();
    BVar10 = temp;
    MVar3 = local_58;
    local_48 = (MTBDD *)(dVar17 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10282d;
    dVar17 = sylvan_satcount_RUN(BVar10,MVar3,arg_3_02);
    pMVar14 = local_48;
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102847;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar14,dVar17);
  }
  pFVar2 = _stdout;
  pcVar15 = "[% 8.2f] Encoding rising diagonals...\n";
  if (report_minor != 0) {
    pcVar15 = "[% 8.2f] Encoding rising diagonals... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10286f;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102884;
  fprintf(pFVar2,pcVar15,dVar17 - t_start);
  uVar8 = 0;
  local_48 = pMVar12;
  uVar7 = extraout_RDX_09;
  pMVar14 = pMVar12;
  while( true ) {
    if (size <= uVar8) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1028ba;
      printf("%zu... ",uVar8);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1028c9;
      fflush(_stdout);
      uVar7 = extraout_RDX_10;
    }
    vars = (BDD)pMVar12;
    for (uVar9 = 0; uVar9 < size; uVar9 = uVar9 + 1) {
      BVar10 = 0x8000000000000000;
      local_40 = 0x8000000000000000;
      lVar11 = 0;
      uVar16 = size;
      for (uVar13 = 0; pMVar14 = local_48, uVar13 < uVar16; uVar13 = uVar13 + 1) {
        if (((uVar8 != uVar13) && (uVar8 <= uVar9 + uVar13)) &&
           (uVar7 = uVar16 + uVar8, uVar9 + uVar13 < uVar7)) {
          uVar16 = *(ulong *)((long)pMVar12 + uVar13 * 8 + uVar16 * lVar11);
          *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10292c;
          BVar10 = sylvan_and_RUN(BVar10,uVar16 ^ 0x8000000000000000,(BDDVAR)uVar7);
          local_40 = BVar10;
          uVar16 = size;
          uVar7 = extraout_RDX_11;
        }
        lVar11 = lVar11 + 8;
      }
      BVar4 = local_48[uVar16 * uVar8 + uVar9];
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10296c;
      BVar4 = sylvan_and_RUN(BVar10 ^ 0x8000000000000000,BVar4,(BDDVAR)uVar7);
      BVar10 = temp;
      local_40 = BVar4 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x10297f;
      temp = sylvan_and_RUN(BVar10,BVar4 ^ 0x8000000000000000,arg_3_03);
      pMVar12 = pMVar12 + 1;
      uVar7 = extraout_RDX_12;
    }
    uVar8 = uVar8 + 1;
    pMVar12 = (MTBDD *)(vars - 8);
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 10;
    uVar6 = *(undefined8 *)((long)&sStack_80 + lVar1);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1029ac;
    putchar((int)uVar6);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1029c4;
    dVar17 = wctime();
    BVar10 = temp;
    MVar3 = local_58;
    vars = (BDD)(dVar17 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1029de;
    dVar17 = sylvan_satcount_RUN(BVar10,MVar3,arg_3_04);
    BVar10 = vars;
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x1029f8;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar10,dVar17);
  }
  pFVar2 = _stdout;
  pcVar15 = "[% 8.2f] Encoding falling diagonals...\n";
  if (report_minor != 0) {
    pcVar15 = "[% 8.2f] Encoding falling diagonals... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102a20;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102a35;
  fprintf(pFVar2,pcVar15,dVar17 - t_start);
  local_60 = pMVar14;
  uVar7 = 0;
  uVar6 = extraout_RDX_13;
  while( true ) {
    if (size <= uVar7) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102a68;
      printf("%zu... ",uVar7);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102a77;
      fflush(_stdout);
      uVar6 = extraout_RDX_14;
    }
    uVar8 = 0;
    pMVar12 = local_60;
    while (uVar8 < size) {
      BVar10 = 0x8000000000000000;
      local_40 = 0x8000000000000000;
      lVar11 = 0;
      uVar9 = size;
      local_70 = uVar8;
      vars = (BDD)pMVar12;
      for (uVar16 = 0; pMVar14 = local_48, uVar13 = local_70, uVar16 < uVar9; uVar16 = uVar16 + 1) {
        if (((uVar7 != uVar16) && (uVar16 <= uVar8 + uVar7)) && (uVar8 + uVar7 < uVar9 + uVar16)) {
          uVar9 = *(ulong *)((long)pMVar12 + uVar9 * lVar11);
          *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102adf;
          BVar10 = sylvan_and_RUN(BVar10,uVar9 ^ 0x8000000000000000,(BDDVAR)uVar6);
          uVar9 = size;
          uVar6 = extraout_RDX_15;
          local_40 = BVar10;
        }
        pMVar12 = pMVar12 + -1;
        lVar11 = lVar11 + 8;
      }
      BVar4 = local_48[uVar9 * uVar7 + local_70];
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102b27;
      BVar4 = sylvan_and_RUN(BVar10 ^ 0x8000000000000000,BVar4,(BDDVAR)uVar6);
      BVar10 = temp;
      local_40 = BVar4 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102b3a;
      temp = sylvan_and_RUN(BVar10,BVar4 ^ 0x8000000000000000,arg_3_05);
      pMVar12 = (MTBDD *)(vars + 8);
      uVar6 = extraout_RDX_16;
      uVar8 = uVar13 + 1;
    }
    uVar7 = uVar7 + 1;
    local_60 = local_60 + 1;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 10;
    uVar6 = *(undefined8 *)((long)&sStack_80 + lVar1);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102b68;
    putchar((int)uVar6);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102b80;
    dVar17 = wctime();
    BVar10 = temp;
    MVar3 = local_58;
    local_48 = (MTBDD *)(dVar17 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102b9a;
    dVar17 = sylvan_satcount_RUN(BVar10,MVar3,arg_3_06);
    pMVar12 = local_48;
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102bb4;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar12,dVar17);
  }
  pFVar2 = _stdout;
  pcVar15 = "[% 8.2f] Final computation to place a queen on every row...\n";
  if (report_minor != 0) {
    pcVar15 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102bdc;
  dVar17 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102bf1;
  fprintf(pFVar2,pcVar15,dVar17 - t_start);
  lVar11 = 0;
  uVar6 = extraout_RDX_17;
  for (uVar7 = 0; uVar7 < size; uVar7 = uVar7 + 1) {
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c25;
      printf("%zu... ",uVar7);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c34;
      fflush(_stdout);
      uVar6 = extraout_RDX_18;
    }
    local_40 = 0;
    uVar8 = 0;
    while( true ) {
      BVar10 = temp;
      MVar3 = local_40;
      if (size <= uVar8) break;
      uVar16 = local_40 ^ 0x8000000000000000;
      uVar9 = *(ulong *)((long)pMVar14 + uVar8 * 8 + size * lVar11);
      *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c63;
      BVar10 = sylvan_and_RUN(uVar16,uVar9 ^ 0x8000000000000000,(BDDVAR)uVar6);
      local_40 = BVar10 ^ 0x8000000000000000;
      uVar8 = uVar8 + 1;
      uVar6 = extraout_RDX_19;
    }
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c7b;
    temp = sylvan_and_RUN(BVar10,MVar3,(BDDVAR)uVar6);
    lVar11 = lVar11 + 8;
    uVar6 = extraout_RDX_20;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar1) = 10;
    uVar6 = *(undefined8 *)((long)&sStack_80 + lVar1);
    *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c97;
    putchar((int)uVar6);
  }
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102c9c;
  local_48 = (MTBDD *)wctime();
  pFVar2 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102cb0;
  dVar17 = wctime();
  BVar10 = temp;
  MVar3 = local_58;
  sVar5 = size;
  vars = (BDD)(dVar17 - t_start);
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102cd1;
  dVar17 = sylvan_satcount_RUN(BVar10,MVar3,arg_3_07);
  BVar10 = vars;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102cee;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",BVar10,dVar17,sVar5);
  pFVar2 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102cf6;
  dVar17 = wctime();
  vars = (BDD)(dVar17 - t_start);
  local_78 = temp;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 1;
  sVar5 = *(size_t *)((long)&sStack_80 + lVar1);
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102d16;
  sVar5 = mtbdd_nodecount_more(&local_78,sVar5);
  BVar10 = vars;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102d2f;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",BVar10,sVar5);
  pFVar2 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102d37;
  dVar17 = wctime();
  dVar18 = (double)local_48 - local_68;
  *(undefined8 *)((long)&sStack_80 + lVar1) = 0x102d5a;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",dVar17 - t_start,dVar18);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}